

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::sizeParameters(QMdiSubWindowPrivate *this,int *margin,int *minWidth)

{
  long lVar1;
  QWidget *this_00;
  bool bVar2;
  int iVar3;
  QStyle *pQVar4;
  int i;
  long lVar5;
  SubControl *pSVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QStyleOptionTitleBar opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) ||
     (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8,
     ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 0x800) != 0)) {
    *margin = 0;
    *minWidth = 0;
    goto LAB_00418088;
  }
  bVar2 = QWidget::isMaximized(this_00);
  if (bVar2) {
    bVar2 = drawTitleBarWhenMaximized(this);
    iVar3 = 0;
    if (!bVar2) goto LAB_00417fcd;
  }
  pQVar4 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x2c,0,this_00);
LAB_00417fcd:
  *margin = iVar3;
  opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt._104_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.palette.d =
       (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOptionComplex.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  titleBarOptions(&opt,this);
  lVar5 = 0;
  pSVar6 = SubControls;
  iVar3 = 0;
  do {
    if (lVar5 == 0) {
      iVar3 = iVar3 + 0x1e;
    }
    else {
      if (lVar5 == 9) break;
      pQVar4 = QWidget::style(this_00);
      auVar7 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,5,&opt,*pSVar6,this_00);
      if ((auVar7._0_4_ <= auVar7._8_4_) && (auVar7._4_4_ <= auVar7._12_4_)) {
        iVar3 = ((iVar3 + auVar7._8_4_) - auVar7._0_4_) + 1;
      }
    }
    lVar5 = lVar5 + 1;
    pSVar6 = pSVar6 + 1;
  } while( true );
  *minWidth = iVar3;
  QStyleOptionTitleBar::~QStyleOptionTitleBar(&opt);
LAB_00418088:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::sizeParameters(int *margin, int *minWidth) const
{
    Q_Q(const QMdiSubWindow);
    Qt::WindowFlags flags = q->windowFlags();
    if (!parent || flags & Qt::FramelessWindowHint) {
        *margin = 0;
        *minWidth = 0;
        return;
    }

    if (q->isMaximized() && !drawTitleBarWhenMaximized())
        *margin = 0;
    else
        *margin = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);

    QStyleOptionTitleBar opt = this->titleBarOptions();
    int tempWidth = 0;
    for (int i = 0; i < NumSubControls; ++i) {
        if (SubControls[i] == QStyle::SC_TitleBarLabel) {
            tempWidth += 30;
            continue;
        }
        QRect rect = q->style()->subControlRect(QStyle::CC_TitleBar, &opt, SubControls[i], q);
        if (!rect.isValid())
            continue;
        tempWidth += rect.width();
    }
    *minWidth = tempWidth;
}